

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta)

{
  int iVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar2;
  undefined8 uVar3;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var4;
  bool bVar5;
  undefined8 extraout_RAX;
  long lVar6;
  long lVar7;
  _Head_base<0UL,_int_*,_false> _Var8;
  uint uVar9;
  type it;
  int *piVar10;
  rc_data *ret;
  rc_data *__first;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  rc_data *prVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_register_00001304 [12];
  float local_bc;
  undefined1 local_90 [16];
  _Head_base<0UL,_int_*,_false> local_80;
  float local_74;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_70;
  solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>
  *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_60;
  pair<int,_int> *local_58;
  long local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current != last._M_current) {
    local_68 = this + 8;
    fVar18 = kappa / (1.0 - kappa);
    local_74 = theta;
    local_60._M_head_impl = (col_value *)last._M_current;
    do {
      if (*(int *)(this + 0x80) <= ((col_value *)first._M_current)->value) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
LAB_0016b977:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_70._M_head_impl = (row_value *)(long)((col_value *)first._M_current)->value;
      local_58 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_90,(int)local_68);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar17 = *(long *)(this + 0x68);
        _Var8._M_head_impl = (int *)local_90._8_8_;
        do {
          *(float *)(lVar17 + (long)*_Var8._M_head_impl * 4) =
               local_74 * *(float *)(lVar17 + (long)*_Var8._M_head_impl * 4);
          _Var8._M_head_impl = _Var8._M_head_impl + 8;
        } while (_Var8._M_head_impl != (int *)local_90._0_8_);
      }
      if (local_90._8_8_ == local_90._0_8_) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        piVar10 = (int *)local_90._8_8_;
        do {
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)local_68);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            local_bc = 0.0;
          }
          else {
            auVar22 = ZEXT816(0) << 0x40;
            do {
              auVar21._0_4_ =
                   (float)*(int *)(*(long *)(this + 0x48) + (long)*local_38._M_head_impl * 4);
              auVar21._4_12_ = in_register_00001304;
              auVar22 = vfmadd231ss_fma(auVar22,auVar21,
                                        ZEXT416(*(uint *)(*(long *)(this + 0x68) +
                                                         (long)*local_38._M_head_impl * 4)));
              local_38._M_head_impl = local_38._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_38._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
            local_bc = auVar22._0_4_;
          }
          lVar17 = *(long *)(this + 0x50);
          lVar11 = uVar15 * 0xc;
          *(int *)(lVar17 + 4 + lVar11) = (int)uVar15;
          *(undefined4 *)(lVar17 + 8 + lVar11) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*piVar10 * 4);
          fVar19 = quadratic_cost_type<float>::operator()
                             (*(quadratic_cost_type<float> **)(this + 0x70),
                              *(int *)(local_90._8_8_ + 4),x);
          *(float *)(*(long *)(this + 0x50) + lVar11) = fVar19 - local_bc;
          piVar10 = piVar10 + 2;
          uVar15 = uVar15 + 1;
        } while (piVar10 != (int *)local_90._0_8_);
      }
      uVar14 = (uint)uVar15;
      local_80._M_head_impl = (int *)(uVar15 & 0xffffffff);
      if (1 < uVar14) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        lVar17 = (long)local_80._M_head_impl * 0xc;
        prVar16 = __first + (long)local_80._M_head_impl;
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar16,(int)LZCOUNT(local_80._M_head_impl) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar16);
        prVar16 = __first + 1;
        lVar17 = lVar17 + -0xc;
        do {
          if ((__first->value != prVar16->value) || (NAN(__first->value) || NAN(prVar16->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar16,__g);
            __first = prVar16;
          }
          prVar16 = prVar16 + 1;
          lVar17 = lVar17 + -0xc;
        } while (lVar17 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,prVar16,__g);
        uVar14 = (uint)local_80._M_head_impl;
      }
      _Var4._M_head_impl = local_70._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) + (long)local_70._M_head_impl * 0xc) < 1) {
        iVar12 = 0;
        uVar15 = 0xffffffff;
      }
      else {
        lVar17 = 0;
        iVar12 = 0;
        uVar13 = 0xffffffffffffffff;
        do {
          uVar3 = local_90._8_8_;
          uVar15 = uVar13 + 1;
          iVar12 = iVar12 + *(int *)(*(long *)(this + 0x50) + 8 + lVar17);
          iVar1 = *(int *)(*(long *)(this + 0x58) + (long)_Var4._M_head_impl * 0xc);
          lVar11 = (long)*(int *)(*(long *)(this + 0x50) + 4 + lVar17);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_90._8_8_ + (lVar11 * 2 + 1) * 4));
          auVar22 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + lVar17) * 0.5
                                                  )),ZEXT416((uint)fVar18),ZEXT416((uint)delta));
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar11 * 2 * 4) * 4) =
               auVar22._0_4_ +
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar11 * 2 * 4) * 4);
          if (iVar1 <= iVar12) break;
          lVar17 = lVar17 + 0xc;
          bVar5 = (long)uVar13 < (long)(int)uVar14 + -2;
          uVar13 = uVar15;
        } while (bVar5);
        uVar14 = (uint)local_80._M_head_impl;
      }
      uVar9 = (uint)uVar15;
      if (iVar12 < *(int *)(*(long *)(this + 0x58) + (long)_Var4._M_head_impl * 0xc)) {
        bVar5 = false;
      }
      else {
        bVar5 = iVar12 <= *(int *)(*(long *)(this + 0x58) + (long)_Var4._M_head_impl * 0xc + 4);
      }
      if (((int)(uVar9 + 1) < (int)uVar14) && (bVar5)) {
        local_48 = (long)(int)uVar14;
        lVar17 = (long)(int)uVar9 * 0xc;
        lVar11 = (long)(int)uVar9 + 2;
        do {
          uVar3 = local_90._8_8_;
          lVar7 = *(long *)(this + 0x50);
          iVar12 = iVar12 + *(int *)(lVar7 + 0x14 + lVar17);
          if (iVar12 < *(int *)(*(long *)(this + 0x58) + (long)_Var4._M_head_impl * 0xc)) {
            bVar5 = false;
          }
          else {
            bVar5 = iVar12 <= *(int *)(*(long *)(this + 0x58) + (long)_Var4._M_head_impl * 0xc + 4);
          }
          lVar6 = (long)*(int *)(lVar7 + 0x10 + lVar17);
          if (bVar5) {
            fVar19 = *(float *)(lVar7 + 0xc + lVar17);
            if ((fVar19 != 0.0) || (NAN(fVar19))) {
              bVar5 = 0.0 < fVar19;
            }
            else {
              local_50 = lVar6;
              dVar20 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar5 = dVar20 < 0.5;
              lVar6 = local_50;
            }
          }
          if (bVar5) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar3 + (lVar6 * 2 + 1) * 4));
            lVar7 = *(long *)(this + 0x68);
            auVar22 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar17) * 0.5)),ZEXT416((uint)fVar18)
                                      ,ZEXT416((uint)delta));
            lVar6 = (long)*(int *)(uVar3 + lVar6 * 2 * 4);
            fVar19 = auVar22._0_4_ + *(float *)(lVar7 + lVar6 * 4);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar3 + (lVar6 * 2 + 1) * 4));
            lVar7 = *(long *)(this + 0x68);
            auVar22 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc +
                                                               lVar17) * 0.5)),ZEXT416((uint)fVar18)
                                      ,ZEXT416((uint)delta));
            lVar6 = (long)*(int *)(uVar3 + lVar6 * 2 * 4);
            fVar19 = *(float *)(lVar7 + lVar6 * 4) - auVar22._0_4_;
          }
          *(float *)(lVar7 + lVar6 * 4) = fVar19;
          bVar2 = lVar11 < local_48;
          uVar9 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar9;
          lVar17 = lVar17 + 0xc;
          lVar11 = lVar11 + 1;
        } while ((bool)(bVar2 & bVar5));
      }
      if ((int)(uVar9 + 1) < (int)local_80._M_head_impl) {
        lVar17 = (long)(int)uVar9 * 0xc;
        iVar12 = ~uVar9 + (int)local_80._M_head_impl;
        do {
          uVar3 = local_90._8_8_;
          lVar11 = (long)*(int *)(*(long *)(this + 0x50) + 0x10 + lVar17);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_90._8_8_ + (lVar11 * 2 + 1) * 4));
          auVar22 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar17)
                                                  * 0.5)),ZEXT416((uint)fVar18),ZEXT416((uint)delta)
                                   );
          *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar11 * 2 * 4) * 4) =
               *(float *)(*(long *)(this + 0x68) + (long)*(int *)(uVar3 + lVar11 * 2 * 4) * 4) -
               auVar22._0_4_;
          lVar17 = lVar17 + 0xc;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      bVar5 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                          *)this,(int)local_70._M_head_impl,x);
      if (!bVar5) goto LAB_0016b977;
      first._M_current = local_58 + 1;
    } while (first._M_current != (pair<int,_int> *)local_60._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }